

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  callable_impl<void,_unit_test::binder> *this_00;
  binder local_38;
  
  this_00 = (callable_impl<void,_unit_test::binder> *)operator_new(0x28);
  local_38.self.p_ = (func->self).p_;
  if (local_38.self.p_ != (unit_test *)0x0) {
    booster::intrusive_ptr_add_ref(&(local_38.self.p_)->super_application);
  }
  local_38.m = func->m;
  local_38._16_8_ = *(undefined8 *)&func->field_0x10;
  callable_impl<void,_unit_test::binder>::callable_impl(this_00,&local_38);
  (this->call_ptr).p_ = (callable<void_(cppcms::http::context::completion_type)> *)this_00;
  booster::atomic_counter::inc();
  intrusive_ptr<unit_test>::~intrusive_ptr(&local_38.self);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}